

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::readBuffer
               (Functions *gl,deUint32 target,int numElements,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *result)

{
  GLboolean GVar1;
  GLenum err;
  TestError *pTVar2;
  reference __dest;
  allocator<char> local_81;
  string local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  void *local_28;
  void *ptr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result_local;
  int numElements_local;
  deUint32 target_local;
  Functions *gl_local;
  
  ptr = result;
  result_local._0_4_ = numElements;
  result_local._4_4_ = target;
  _numElements_local = gl;
  local_28 = (*gl->mapBufferRange)(target,0,(long)(numElements << 2),1);
  err = (*_numElements_local->getError)();
  glu::checkError(err,"map",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x51);
  if (local_28 == (void *)0x0) {
    local_5d = 1;
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"mapBufferRange returned NULL",&local_49);
    tcu::TestError::TestError(pTVar2,&local_48);
    local_5d = 0;
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ptr,(long)(int)result_local);
  __dest = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ptr,0);
  memcpy(__dest,local_28,(long)(int)result_local << 2);
  GVar1 = (*_numElements_local->unmapBuffer)(result_local._4_4_);
  if (GVar1 == '\0') {
    pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"unmapBuffer returned false",&local_81);
    tcu::TestError::TestError(pTVar2,&local_80);
    __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

static void readBuffer (const glw::Functions& gl, deUint32 target, int numElements, std::vector<deUint32>& result)
{
	const void* ptr = gl.mapBufferRange(target, 0, (int)(sizeof(deUint32) * numElements), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "map");

	if (!ptr)
		throw tcu::TestError("mapBufferRange returned NULL");

	result.resize(numElements);
	memcpy(&result[0], ptr, sizeof(deUint32) * numElements);

	if (gl.unmapBuffer(target) == GL_FALSE)
		throw tcu::TestError("unmapBuffer returned false");
}